

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void test_handshake(ptls_iovec_t ticket,int use_early_data)

{
  size_t sVar1;
  int iVar2;
  ptls_t *tls;
  ptls_t *tls_00;
  undefined8 uVar3;
  bool bVar4;
  size_t consumed;
  ptls_buffer_t cbuf;
  ptls_buffer_t sbuf;
  ptls_buffer_t decbuf;
  size_t max_early_data_size;
  ptls_handshake_properties_t local_c058;
  uint8_t decbuf_small [16384];
  uint8_t sbuf_small [16384];
  uint8_t cbuf_small [16384];
  
  local_c058.client.session_ticket.len = ticket.len;
  local_c058.client.session_ticket.base = ticket.base;
  local_c058.client.max_early_data_size = (size_t *)0x0;
  local_c058._24_1_ = 0;
  max_early_data_size = 0;
  tls = ptls_new(ctx,"example.com");
  tls_00 = ptls_new(ctx_peer,(char *)0x0);
  cbuf.base = cbuf_small;
  cbuf.off = 0;
  cbuf.capacity = 0x4000;
  cbuf.is_allocated = 0;
  sbuf.base = sbuf_small;
  sbuf.off = 0;
  sbuf.capacity = 0x4000;
  sbuf.is_allocated = 0;
  decbuf.base = decbuf_small;
  decbuf.off = 0;
  decbuf.capacity = 0x4000;
  decbuf.is_allocated = 0;
  if (use_early_data == 0) {
    iVar2 = ptls_handshake(tls,&cbuf,(void *)0x0,(size_t *)0x0,&local_c058);
    _ok((uint)(iVar2 == 0x202),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0x8f);
    bVar4 = cbuf.off != 0;
    uVar3 = 0x90;
  }
  else {
    if (ctx_peer->max_early_data_size == 0) {
      __assert_fail("ctx_peer->max_early_data_size != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
                    ,0x8b,"void test_handshake(ptls_iovec_t, int)");
    }
    local_c058.client.max_early_data_size = &max_early_data_size;
    iVar2 = ptls_handshake(tls,&cbuf,(void *)0x0,(size_t *)0x0,&local_c058);
    _ok((uint)(iVar2 == 0x202),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0x8f);
    _ok((uint)(cbuf.off != 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0x90);
    _ok((uint)(max_early_data_size == ctx_peer->max_early_data_size),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0x93);
    iVar2 = ptls_send(tls,&cbuf,"GET / HTTP/1.0\r\n\r\n",0x12);
    bVar4 = iVar2 == 0;
    uVar3 = 0x95;
  }
  _ok((uint)bVar4,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      uVar3);
  consumed = cbuf.off;
  iVar2 = ptls_handshake(tls_00,&sbuf,cbuf.base,&consumed,(ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0x9a);
  _ok((uint)(sbuf.off != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0x9b);
  sVar1 = consumed;
  if (use_early_data == 0) {
    _ok((uint)(consumed == cbuf.off),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xaf);
    cbuf.off = 0;
  }
  else {
    _ok((uint)(consumed < cbuf.off),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0x9e);
    memmove(cbuf.base,cbuf.base + sVar1,cbuf.off - sVar1);
    consumed = cbuf.off - sVar1;
    cbuf.off = consumed;
    iVar2 = ptls_receive(tls_00,&decbuf,cbuf.base,&consumed);
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xa4);
    _ok((uint)(consumed == cbuf.off),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xa5);
    sVar1 = decbuf.off;
    _ok((uint)(decbuf.off == 0x12),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xa6);
    iVar2 = bcmp(decbuf.base,"GET / HTTP/1.0\r\n\r\n",sVar1);
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xa7);
    _ok((uint)((tls_00->field_7).server.early_data != (st_ptls_early_data_receiver_t *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xa8);
    cbuf.off = 0;
    decbuf.off = 0;
    iVar2 = ptls_send(tls_00,&sbuf,"HTTP/1.0 200 OK\r\n\r\nhello world\n",0x1f);
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xad);
  }
  consumed = sbuf.off;
  iVar2 = ptls_handshake(tls,&cbuf,sbuf.base,&consumed,(ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0xb5);
  _ok((uint)(cbuf.off != 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0xb6);
  sVar1 = consumed;
  if (use_early_data == 0) {
    _ok((uint)(consumed == sbuf.off),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xbd);
    sbuf.off = 0;
    iVar2 = ptls_send(tls,&cbuf,"GET / HTTP/1.0\r\n\r\n",0x12);
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xc1);
    consumed = cbuf.off;
    iVar2 = ptls_receive(tls_00,&decbuf,cbuf.base,&consumed);
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xc5);
    _ok((uint)(consumed == cbuf.off),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xc6);
    _ok((uint)(decbuf.off == 0x12),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        199);
    iVar2 = bcmp(decbuf.base,"GET / HTTP/1.0\r\n\r\n",0x12);
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        200);
    _ok((uint)((tls_00->field_7).server.early_data == (st_ptls_early_data_receiver_t *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xc9);
    decbuf.off = 0;
    iVar2 = ptls_send(tls_00,&sbuf,"HTTP/1.0 200 OK\r\n\r\nhello world\n",0x1f);
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xcd);
  }
  else {
    _ok((uint)(consumed < sbuf.off),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xb9);
    memmove(sbuf.base,sbuf.base + sVar1,sbuf.off - sVar1);
    sbuf.off = sbuf.off - sVar1;
  }
  consumed = sbuf.off;
  iVar2 = ptls_receive(tls,&decbuf,sbuf.base,&consumed);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0xd2);
  _ok((uint)(consumed == sbuf.off),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0xd3);
  _ok((uint)(decbuf.off == 0x1f),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0xd4);
  iVar2 = bcmp(decbuf.base,"HTTP/1.0 200 OK\r\n\r\nhello world\n",0x1f);
  _ok((uint)(iVar2 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0xd5);
  _ok((uint)((tls->field_7).server.early_data == (st_ptls_early_data_receiver_t *)0x0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0xd6);
  decbuf.off = 0;
  if (use_early_data != 0) {
    consumed = cbuf.off;
    iVar2 = ptls_receive(tls_00,&decbuf,cbuf.base,&consumed);
    _ok((uint)(iVar2 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xdc);
    _ok((uint)(cbuf.off == consumed),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xdd);
    _ok((uint)(decbuf.off == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xde);
    _ok((uint)((tls->field_7).server.early_data == (st_ptls_early_data_receiver_t *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0xdf);
  }
  ptls_buffer_dispose(&cbuf);
  ptls_buffer_dispose(&sbuf);
  ptls_buffer_dispose(&decbuf);
  ptls_free(tls);
  ptls_free(tls_00);
  return;
}

Assistant:

static void test_handshake(ptls_iovec_t ticket, int use_early_data)
{
    ptls_t *client, *server;
    ptls_handshake_properties_t client_hs_prop = {{ticket}};
    uint8_t cbuf_small[16384], sbuf_small[16384], decbuf_small[16384];
    ptls_buffer_t cbuf, sbuf, decbuf;
    size_t consumed, max_early_data_size = 0;
    int ret;
    const char *req = "GET / HTTP/1.0\r\n\r\n";
    const char *resp = "HTTP/1.0 200 OK\r\n\r\nhello world\n";

    client = ptls_new(ctx, "example.com");
    server = ptls_new(ctx_peer, NULL);
    ptls_buffer_init(&cbuf, cbuf_small, sizeof(cbuf_small));
    ptls_buffer_init(&sbuf, sbuf_small, sizeof(sbuf_small));
    ptls_buffer_init(&decbuf, decbuf_small, sizeof(decbuf_small));

    if (use_early_data) {
        assert(ctx_peer->max_early_data_size != 0);
        client_hs_prop.client.max_early_data_size = &max_early_data_size;
    }
    ret = ptls_handshake(client, &cbuf, NULL, NULL, &client_hs_prop);
    ok(ret == PTLS_ERROR_HANDSHAKE_IN_PROGRESS);
    ok(cbuf.off != 0);

    if (use_early_data) {
        ok(max_early_data_size == ctx_peer->max_early_data_size);
        ret = ptls_send(client, &cbuf, req, strlen(req));
        ok(ret == 0);
    }

    consumed = cbuf.off;
    ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, NULL);
    ok(ret == 0);
    ok(sbuf.off != 0);

    if (use_early_data) {
        ok(consumed < cbuf.off);
        memmove(cbuf.base, cbuf.base + consumed, cbuf.off - consumed);
        cbuf.off -= consumed;

        consumed = cbuf.off;
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
        ok(ret == 0);
        ok(consumed == cbuf.off);
        ok(decbuf.off == strlen(req));
        ok(memcmp(decbuf.base, req, decbuf.off) == 0);
        ok(ptls_is_early_data(server));
        cbuf.off = 0;
        decbuf.off = 0;

        ret = ptls_send(server, &sbuf, resp, strlen(resp));
        ok(ret == 0);
    } else {
        ok(consumed == cbuf.off);
        cbuf.off = 0;
    }

    consumed = sbuf.off;
    ret = ptls_handshake(client, &cbuf, sbuf.base, &consumed, NULL);
    ok(ret == 0);
    ok(cbuf.off != 0);

    if (use_early_data) {
        ok(consumed < sbuf.off);
        memmove(sbuf.base, sbuf.base + consumed, sbuf.off - consumed);
        sbuf.off -= consumed;
    } else {
        ok(consumed == sbuf.off);
        sbuf.off = 0;

        ret = ptls_send(client, &cbuf, req, strlen(req));
        ok(ret == 0);

        consumed = cbuf.off;
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
        ok(ret == 0);
        ok(consumed == cbuf.off);
        ok(decbuf.off == strlen(req));
        ok(memcmp(decbuf.base, req, strlen(req)) == 0);
        ok(!ptls_is_early_data(server));
        decbuf.off = 0;

        ret = ptls_send(server, &sbuf, resp, strlen(resp));
        ok(ret == 0);
    }

    consumed = sbuf.off;
    ret = ptls_receive(client, &decbuf, sbuf.base, &consumed);
    ok(ret == 0);
    ok(consumed == sbuf.off);
    ok(decbuf.off == strlen(resp));
    ok(memcmp(decbuf.base, resp, strlen(resp)) == 0);
    ok(!ptls_is_early_data(client));
    decbuf.off = 0;

    if (use_early_data) {
        consumed = cbuf.off;
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
        ok(ret == 0);
        ok(cbuf.off == consumed);
        ok(decbuf.off == 0);
        ok(!ptls_is_early_data(client));
    }

    ptls_buffer_dispose(&cbuf);
    ptls_buffer_dispose(&sbuf);
    ptls_buffer_dispose(&decbuf);
    ptls_free(client);
    ptls_free(server);
}